

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void plot_ringer(tgestate_t *state,uint8_t *src)

{
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  tgestate_t *unaff_retaddr;
  uint8_t in_stack_ffffffffffffffee;
  uint8_t in_stack_ffffffffffffffef;
  
  plot_bitmap(unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffef,in_stack_ffffffffffffffee);
  return;
}

Assistant:

void plot_ringer(tgestate_t *state, const uint8_t *src)
{
  assert(state != NULL);
  assert(src   != NULL);

  plot_bitmap(state,
              src,
              &state->speccy->screen.pixels[screenoffset_BELL_RINGER],
              1, 12 /* dimensions: 8 x 12 */);
}